

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImPool<ImGuiTable>::Clear(ImPool<ImGuiTable> *this)

{
  int *piVar1;
  uint uVar2;
  ImGuiTable *pIVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = (this->Map).Data.Size;
  if (0 < iVar4) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      uVar2 = *(uint *)((long)&((this->Map).Data.Data)->key + lVar5);
      if ((ulong)uVar2 != 0xffffffff) {
        if (((int)uVar2 < 0) || ((this->Buf).Size <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                        ,0x706,"T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]");
        }
        ImGuiTable::~ImGuiTable((this->Buf).Data + uVar2);
        iVar4 = (this->Map).Data.Size;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < iVar4);
  }
  ImGuiStorage::Clear(&this->Map);
  pIVar3 = (this->Buf).Data;
  if (pIVar3 != (ImGuiTable *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    (this->Buf).Data = (ImGuiTable *)0x0;
  }
  this->FreeIdx = 0;
  this->AliveCount = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = AliveCount = 0; }